

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_set_operation.cpp
# Opt level: O1

void duckdb::ReplaceSetOpBindings
               (vector<duckdb::ColumnBinding,_true> *bindings,Filter *filter,Expression *expr,
               LogicalSetOperation *setop)

{
  undefined4 uVar1;
  undefined4 uVar2;
  idx_t iVar3;
  BoundColumnRefExpression *pBVar4;
  reference pvVar5;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    pvVar5 = vector<duckdb::ColumnBinding,_true>::operator[]
                       (bindings,(pBVar4->binding).column_index);
    uVar1 = *(undefined4 *)((long)&pvVar5->table_index + 4);
    iVar3 = pvVar5->column_index;
    uVar2 = *(undefined4 *)((long)&pvVar5->column_index + 4);
    *(int *)&(pBVar4->binding).table_index = (int)pvVar5->table_index;
    *(undefined4 *)((long)&(pBVar4->binding).table_index + 4) = uVar1;
    *(int *)&(pBVar4->binding).column_index = (int)iVar3;
    *(undefined4 *)((long)&(pBVar4->binding).column_index + 4) = uVar2;
    local_48._M_unused._M_object = filter;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)filter,&pBVar4->binding);
  }
  else {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(vector<duckdb::ColumnBinding,_true> **)local_48._M_unused._0_8_ = bindings;
    *(Filter **)((long)local_48._M_unused._0_8_ + 8) = filter;
    *(LogicalSetOperation **)((long)local_48._M_unused._0_8_ + 0x10) = setop;
    pcStack_30 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pushdown/pushdown_set_operation.cpp:27:12)>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pushdown/pushdown_set_operation.cpp:27:12)>
               ::_M_manager;
    ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

static void ReplaceSetOpBindings(vector<ColumnBinding> &bindings, Filter &filter, Expression &expr,
                                 LogicalSetOperation &setop) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expr.Cast<BoundColumnRefExpression>();
		D_ASSERT(colref.binding.table_index == setop.table_index);
		D_ASSERT(colref.depth == 0);

		// rewrite the binding by looking into the bound_tables list of the subquery
		colref.binding = bindings[colref.binding.column_index];
		filter.bindings.insert(colref.binding.table_index);
		return;
	}
	ExpressionIterator::EnumerateChildren(
	    expr, [&](Expression &child) { ReplaceSetOpBindings(bindings, filter, child, setop); });
}